

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O2

void bitset_set_list(uint64_t *words,uint16_t *list,uint64_t length)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = croaring_hardware_support();
  if ((uVar3 & 1) == 0) {
    for (lVar4 = 0; length * 2 != lVar4; lVar4 = lVar4 + 2) {
      words[*(ushort *)((long)list + lVar4) >> 6] =
           words[*(ushort *)((long)list + lVar4) >> 6] |
           1L << ((byte)*(ushort *)((long)list + lVar4) & 0x3f);
    }
  }
  else {
    for (lVar4 = 0; (uint16_t *)((long)list + lVar4 + 6) < list + length; lVar4 = lVar4 + 8) {
      uVar1 = *(ushort *)((long)list + lVar4) >> 6;
      words[uVar1] = words[uVar1] | 1L << ((ulong)*(ushort *)((long)list + lVar4) & 0x3f);
      uVar1 = *(ushort *)((long)list + lVar4 + 2);
      uVar2 = uVar1 >> 6;
      words[uVar2] = words[uVar2] | 1L << ((ulong)uVar1 & 0x3f);
      uVar1 = *(ushort *)((long)list + lVar4 + 4);
      uVar2 = uVar1 >> 6;
      words[uVar2] = words[uVar2] | 1L << ((ulong)uVar1 & 0x3f);
      uVar1 = *(ushort *)((long)list + lVar4 + 6);
      uVar2 = uVar1 >> 6;
      words[uVar2] = words[uVar2] | 1L << ((ulong)uVar1 & 0x3f);
    }
    for (; length * 2 != lVar4; lVar4 = lVar4 + 2) {
      uVar1 = *(ushort *)((long)list + lVar4) >> 6;
      words[uVar1] = words[uVar1] | 1L << ((ulong)*(ushort *)((long)list + lVar4) & 0x3f);
    }
  }
  return;
}

Assistant:

void bitset_set_list(uint64_t *words, const uint16_t *list, uint64_t length) {
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
        _asm_bitset_set_list(words, list, length);
    } else {
        _scalar_bitset_set_list(words, list, length);
    }
}